

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O2

void __thiscall
duckdb::PrimitiveDictionary<long,_long,_duckdb::ParquetTimestampSOperator>::PrimitiveDictionary
          (PrimitiveDictionary<long,_long,_duckdb::ParquetTimestampSOperator> *this,
          Allocator *allocator_p,idx_t maximum_size_p,idx_t maximum_target_capacity_p)

{
  ulong uVar1;
  primitive_dictionary_entry_t *ppVar2;
  uint64_t uVar3;
  uint32_t *puVar4;
  ulong uVar5;
  
  this->allocator = allocator_p;
  this->maximum_size = maximum_size_p;
  this->size = 0;
  uVar3 = NextPowerOfTwo(maximum_size_p * 2);
  this->capacity = uVar3;
  this->capacity_mask = uVar3 - 1;
  this->maximum_target_capacity = maximum_target_capacity_p;
  Allocator::Allocate(&this->allocated_dictionary,this->allocator,uVar3 << 4);
  Allocator::Allocate(&this->allocated_target,this->allocator,this->capacity << 3);
  MemoryStream::MemoryStream
            (&this->target_stream,(this->allocated_target).pointer,
             (this->allocated_target).allocated_size);
  uVar1 = this->capacity;
  ppVar2 = (primitive_dictionary_entry_t *)(this->allocated_dictionary).pointer;
  this->dictionary = ppVar2;
  this->full = false;
  puVar4 = &ppVar2->index;
  for (uVar5 = 0; uVar5 < uVar1; uVar5 = uVar5 + 1) {
    *puVar4 = 0xffffffff;
    puVar4 = puVar4 + 4;
  }
  return;
}

Assistant:

PrimitiveDictionary(Allocator &allocator_p, idx_t maximum_size_p, idx_t maximum_target_capacity_p)
	    : allocator(allocator_p), maximum_size(maximum_size_p), size(0),
	      capacity(NextPowerOfTwo(maximum_size * LOAD_FACTOR)), capacity_mask(capacity - 1),
	      maximum_target_capacity(maximum_target_capacity_p),
	      allocated_dictionary(allocator.Allocate(capacity * sizeof(primitive_dictionary_entry_t))),
	      allocated_target(allocator.Allocate(std::is_same<TGT, string_t>::value
	                                              ? MinValue(INITIAL_TARGET_CAPACITY, maximum_target_capacity)
	                                              : capacity * sizeof(TGT))),
	      target_stream(allocated_target.get(), allocated_target.GetSize()),
	      dictionary(reinterpret_cast<primitive_dictionary_entry_t *>(allocated_dictionary.get())), full(false) {
		// Initialize empty
		for (idx_t i = 0; i < capacity; i++) {
			dictionary[i].index = INVALID_INDEX;
		}
	}